

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaCheckReference
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlNodePtr node,xmlAttrPtr attr,
              xmlChar *namespaceName)

{
  int iVar1;
  int iVar2;
  char *message;
  xmlSchemaSchemaRelationPtr_conflict rel;
  xmlSchemaSchemaRelationPtr_conflict pxVar3;
  
  iVar1 = xmlStrEqual(pctxt->targetNamespace,(xmlChar *)attr);
  iVar2 = 0;
  if ((iVar1 == 0) &&
     (iVar1 = xmlStrEqual((xmlChar *)"http://www.w3.org/2001/XMLSchema",(xmlChar *)attr), iVar2 = 0,
     iVar1 == 0)) {
    for (pxVar3 = pctxt->constructor->bucket->relations;
        pxVar3 != (xmlSchemaSchemaRelationPtr_conflict)0x0; pxVar3 = pxVar3->next) {
      if (((uint)pxVar3->type < 2) &&
         (iVar2 = xmlStrEqual((xmlChar *)attr,pxVar3->importNamespace), iVar2 != 0)) {
        return 0;
      }
    }
    if (node != (xmlNodePtr)0x0) {
      schema = (xmlSchemaPtr)node;
    }
    if (attr == (xmlAttrPtr)0x0) {
      message = 
      "References from this schema to components in no namespace are not allowed, since not indicated by an import statement"
      ;
      attr = (xmlAttrPtr)0x0;
    }
    else {
      message = 
      "References from this schema to components in the namespace \'%s\' are not allowed, since not indicated by an import statement"
      ;
    }
    iVar2 = 0xbbc;
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_RESOLVE,(xmlNodePtr)schema,
                        (xmlSchemaBasicItemPtr)0x0,message,(xmlChar *)attr,(xmlChar *)0x0,
                        (xmlChar *)0x0,(xmlChar *)0x0);
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaCheckReference(xmlSchemaParserCtxtPtr pctxt,
		  xmlSchemaPtr schema ATTRIBUTE_UNUSED,
		  xmlNodePtr node,
		  xmlAttrPtr attr,
		  const xmlChar *namespaceName)
{
    /* TODO: Pointer comparison instead? */
    if (xmlStrEqual(pctxt->targetNamespace, namespaceName))
	return (0);
    if (xmlStrEqual(xmlSchemaNs, namespaceName))
	return (0);
    /*
    * Check if the referenced namespace was <import>ed.
    */
    if (WXS_BUCKET(pctxt)->relations != NULL) {
	xmlSchemaSchemaRelationPtr rel;

	rel = WXS_BUCKET(pctxt)->relations;
	do {
	    if (WXS_IS_BUCKET_IMPMAIN(rel->type) &&
		xmlStrEqual(namespaceName, rel->importNamespace))
		return (0);
	    rel = rel->next;
	} while (rel != NULL);
    }
    /*
    * No matching <import>ed namespace found.
    */
    {
	xmlNodePtr n = (attr != NULL) ? (xmlNodePtr) attr : node;

	if (namespaceName == NULL)
	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		XML_SCHEMAP_SRC_RESOLVE, n, NULL,
		"References from this schema to components in no "
		"namespace are not allowed, since not indicated by an "
		"import statement", NULL, NULL);
	else
	    xmlSchemaCustomErr(ACTXT_CAST pctxt,
		XML_SCHEMAP_SRC_RESOLVE, n, NULL,
		"References from this schema to components in the "
		"namespace '%s' are not allowed, since not indicated by an "
		"import statement", namespaceName, NULL);
    }
    return (XML_SCHEMAP_SRC_RESOLVE);
}